

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifLibBox.c
# Opt level: O1

void If_LibBoxWrite(char *pFileName,If_LibBox_t *p)

{
  FILE *__stream;
  
  __stream = fopen(pFileName,"wb");
  if (__stream != (FILE *)0x0) {
    If_LibBoxPrint((FILE *)__stream,p);
    fclose(__stream);
    return;
  }
  printf("Cannot open file \"%s\".\n",pFileName);
  return;
}

Assistant:

void If_LibBoxWrite( char * pFileName, If_LibBox_t * p )
{
    FILE * pFile;
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        printf( "Cannot open file \"%s\".\n", pFileName );
        return;
    }
    If_LibBoxPrint( pFile, p );
    fclose( pFile );
}